

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Cache * leveldb::NewLRUCache(size_t capacity)

{
  undefined8 *puVar1;
  Cache *pCVar2;
  long lVar3;
  long lVar4;
  
  pCVar2 = (Cache *)operator_new(0xdc0);
  pCVar2->_vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_0013f6a8;
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pCVar2[0xd].rep_ + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar2[1]._vptr_Cache + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar2[2]._vptr_Cache + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar2[3]._vptr_Cache + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pCVar2[4]._vptr_Cache + lVar4) = 0;
    anon_unknown_0::HandleTable::Resize((HandleTable *)((long)&pCVar2[0xd].rep_ + lVar4));
    lVar3 = (long)&pCVar2[4].rep_ + lVar4;
    *(long *)((long)&pCVar2[6]._vptr_Cache + lVar4) = lVar3;
    *(long *)((long)&pCVar2[6].rep_ + lVar4) = lVar3;
    lVar3 = (long)&pCVar2[9]._vptr_Cache + lVar4;
    *(long *)((long)&pCVar2[10].rep_ + lVar4) = lVar3;
    *(long *)((long)&pCVar2[0xb]._vptr_Cache + lVar4) = lVar3;
    lVar4 = lVar4 + 0xd8;
  } while (lVar4 != 0xd80);
  pCVar2[0xdb]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xdb].rep_ = (Rep *)0x0;
  pCVar2[0xda]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xda].rep_ = (Rep *)0x0;
  pCVar2[0xd9]._vptr_Cache = (_func_int **)0x0;
  pCVar2[0xd9].rep_ = (Rep *)0x0;
  lVar4 = 0x10;
  do {
    *(size_t *)((long)&pCVar2->_vptr_Cache + lVar4) = capacity + 0xf >> 4;
    lVar4 = lVar4 + 0xd8;
  } while (lVar4 != 0xd90);
  return pCVar2;
}

Assistant:

Cache* NewLRUCache(size_t capacity) { return new ShardedLRUCache(capacity); }